

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

Symbol * __thiscall slang::ast::Scope::find(Scope *this,string_view name)

{
  char *pcVar1;
  SymbolKind SVar2;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  long lVar3;
  uint uVar4;
  byte bVar5;
  size_t __n;
  char *__s1;
  int iVar6;
  uint uVar7;
  uint64_t uVar8;
  SubroutineSymbol *pSVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  size_type __rlen;
  ulong uVar13;
  Scope *pSVar14;
  undefined1 auVar15 [16];
  char cVar16;
  char cVar17;
  char cVar18;
  byte bVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  byte bVar31;
  size_t pos;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  local_68._M_str = name._M_str;
  local_68._M_len = name._M_len;
  if (this->deferredMemberIndex != Invalid) {
    elaborate(this);
  }
  this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this->nameMap;
  uVar8 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                    (this_00,&local_68);
  __s1 = local_68._M_str;
  __n = local_68._M_len;
  uVar10 = uVar8 >> ((byte)*this_00 & 0x3f);
  lVar3 = *(long *)(this_00 + 0x10);
  lVar11 = (uVar8 & 0xff) * 4;
  cVar16 = (&UNK_00461acc)[lVar11];
  cVar17 = (&UNK_00461acd)[lVar11];
  cVar18 = (&UNK_00461ace)[lVar11];
  bVar19 = (&UNK_00461acf)[lVar11];
  uVar13 = 0;
  cVar20 = cVar16;
  cVar21 = cVar17;
  cVar22 = cVar18;
  bVar23 = bVar19;
  cVar24 = cVar16;
  cVar25 = cVar17;
  cVar26 = cVar18;
  bVar27 = bVar19;
  cVar28 = cVar16;
  cVar29 = cVar17;
  cVar30 = cVar18;
  bVar31 = bVar19;
  do {
    pcVar1 = (char *)(lVar3 + uVar10 * 0x10);
    local_48 = *pcVar1;
    cStack_47 = pcVar1[1];
    cStack_46 = pcVar1[2];
    bStack_45 = pcVar1[3];
    cStack_44 = pcVar1[4];
    cStack_43 = pcVar1[5];
    cStack_42 = pcVar1[6];
    bStack_41 = pcVar1[7];
    cStack_40 = pcVar1[8];
    cStack_3f = pcVar1[9];
    cStack_3e = pcVar1[10];
    bStack_3d = pcVar1[0xb];
    cStack_3c = pcVar1[0xc];
    cStack_3b = pcVar1[0xd];
    cStack_3a = pcVar1[0xe];
    bVar5 = pcVar1[0xf];
    auVar15[0] = -(local_48 == cVar16);
    auVar15[1] = -(cStack_47 == cVar17);
    auVar15[2] = -(cStack_46 == cVar18);
    auVar15[3] = -(bStack_45 == bVar19);
    auVar15[4] = -(cStack_44 == cVar20);
    auVar15[5] = -(cStack_43 == cVar21);
    auVar15[6] = -(cStack_42 == cVar22);
    auVar15[7] = -(bStack_41 == bVar23);
    auVar15[8] = -(cStack_40 == cVar24);
    auVar15[9] = -(cStack_3f == cVar25);
    auVar15[10] = -(cStack_3e == cVar26);
    auVar15[0xb] = -(bStack_3d == bVar27);
    auVar15[0xc] = -(cStack_3c == cVar28);
    auVar15[0xd] = -(cStack_3b == cVar29);
    auVar15[0xe] = -(cStack_3a == cVar30);
    auVar15[0xf] = -(bVar5 == bVar31);
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
    if (uVar7 != 0) {
      lVar11 = *(long *)(this_00 + 0x18) + uVar10 * 0x168;
      local_58 = cVar16;
      cStack_57 = cVar17;
      cStack_56 = cVar18;
      bStack_55 = bVar19;
      cStack_54 = cVar20;
      cStack_53 = cVar21;
      cStack_52 = cVar22;
      bStack_51 = bVar23;
      cStack_50 = cVar24;
      cStack_4f = cVar25;
      cStack_4e = cVar26;
      bStack_4d = bVar27;
      cStack_4c = cVar28;
      cStack_4b = cVar29;
      cStack_4a = cVar30;
      bStack_49 = bVar31;
      bStack_39 = bVar5;
      do {
        uVar4 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        lVar12 = (ulong)uVar4 * 0x18;
        if ((__n == *(size_t *)(lVar11 + lVar12)) &&
           ((__n == 0 ||
            (iVar6 = bcmp(__s1,*(void **)(lVar11 + 8 + lVar12),__n), cVar16 = local_58,
            cVar17 = cStack_57, cVar18 = cStack_56, bVar19 = bStack_55, cVar20 = cStack_54,
            cVar21 = cStack_53, cVar22 = cStack_52, bVar23 = bStack_51, cVar24 = cStack_50,
            cVar25 = cStack_4f, cVar26 = cStack_4e, bVar27 = bStack_4d, cVar28 = cStack_4c,
            cVar29 = cStack_4b, cVar30 = cStack_4a, bVar31 = bStack_49, iVar6 == 0)))) {
          pSVar14 = (Scope *)(lVar11 + lVar12 + 0x10);
          while( true ) {
            pSVar9 = (SubroutineSymbol *)pSVar14->compilation;
            SVar2 = (pSVar9->super_Symbol).kind;
            if (SVar2 != TransparentMember) break;
            pSVar14 = &pSVar9->super_Scope;
          }
          if (SVar2 == ForwardingTypedef) {
            return &((SubroutineSymbol *)0x0)->super_Symbol;
          }
          if (SVar2 == ModportClocking) {
            return &((SubroutineSymbol *)(pSVar9->super_Scope).compilation)->super_Symbol;
          }
          if (SVar2 == ExplicitImport) {
            return &((SubroutineSymbol *)0x0)->super_Symbol;
          }
          if (SVar2 == MethodPrototype) {
            pSVar9 = MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)pSVar9);
            return &pSVar9->super_Symbol;
          }
          return &pSVar9->super_Symbol;
        }
        uVar7 = uVar7 - 1 & uVar7;
      } while (uVar7 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar8 & 7] & bVar5) == 0) {
      return &((SubroutineSymbol *)0x0)->super_Symbol;
    }
    lVar11 = uVar10 + uVar13;
    uVar13 = uVar13 + 1;
    uVar10 = lVar11 + 1U & *(ulong *)(this_00 + 8);
    if (*(ulong *)(this_00 + 8) < uVar13) {
      return &((SubroutineSymbol *)0x0)->super_Symbol;
    }
  } while( true );
}

Assistant:

const Symbol* Scope::find(std::string_view name) const {
    // Just do a simple lookup and return the result if we have one.
    ensureElaborated();
    auto it = nameMap->find(name);
    if (it == nameMap->end())
        return nullptr;

    // Unwrap the symbol if it's a transparent member. Don't return imported
    // symbols; this function is for querying direct members only.
    const Symbol* symbol = it->second;
    while (symbol->kind == SymbolKind::TransparentMember)
        symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

    switch (symbol->kind) {
        case SymbolKind::ExplicitImport:
        case SymbolKind::ForwardingTypedef:
            return nullptr;
        case SymbolKind::MethodPrototype:
            return symbol->as<MethodPrototypeSymbol>().getSubroutine();
        case SymbolKind::ModportClocking:
            return symbol->as<ModportClockingSymbol>().target;
        default:
            return symbol;
    }
}